

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddDefaultValue(Parse *pParse,ExprSpan *pSpan)

{
  short sVar1;
  sqlite3 *db;
  Table *pTVar2;
  Column *pCVar3;
  char *__src;
  undefined1 uVar4;
  anon_union_8_2_443a03b8_for_u __dest;
  Expr *pEVar5;
  size_t __n;
  Expr x;
  undefined1 local_78 [40];
  anon_union_8_11_9d6f43ba_for_u aStack_50;
  undefined8 local_48;
  AggInfo *pAStack_40;
  Table *local_38;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (pTVar2 == (Table *)0x0) goto LAB_0014ca2f;
  sVar1 = pTVar2->nCol;
  pCVar3 = pTVar2->aCol;
  uVar4 = (db->init).busy + '\x04';
  local_78[0x24] = uVar4;
  local_78._8_8_ = exprNodeIsConstant;
  local_78._16_8_ = selectNodeIsConstant;
  aStack_50.pNC = aStack_50.pNC & 0xffffffff00000000;
  if (pSpan->pExpr != (Expr *)0x0) {
    walkExpr((Walker *)local_78,pSpan->pExpr);
    uVar4 = local_78[0x24];
  }
  if (uVar4 == '\0') {
    sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",
                    pCVar3[(long)sVar1 + -1].zName);
    goto LAB_0014ca2f;
  }
  if (pCVar3[(long)sVar1 + -1].pDflt != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pCVar3[(long)sVar1 + -1].pDflt);
  }
  local_78._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
  local_48._0_2_ = 0;
  local_48._2_2_ = 0;
  local_48._4_2_ = 0;
  local_48._6_1_ = '\0';
  local_48._7_1_ = 0;
  pAStack_40 = (AggInfo *)0x0;
  local_78._32_8_ = (ExprList *)0x0;
  aStack_50.pNC = (NameContext *)0x0;
  local_78._16_8_ = (Expr *)0x0;
  local_78._24_8_ = (Expr *)0x0;
  local_38 = (Table *)0x0;
  local_78._0_8_ = (Parse *)0xa2;
  __src = pSpan->zStart;
  if (__src == (char *)0x0) {
LAB_0014c9d4:
    __dest.zToken = (char *)0x0;
  }
  else {
    __n = (size_t)(*(int *)&pSpan->zEnd - (int)__src);
    __dest.zToken = (char *)sqlite3DbMallocRawNN(db,__n + 1);
    if ((_func_int_Walker_ptr_Expr_ptr *)__dest.zToken == (_func_int_Walker_ptr_Expr_ptr *)0x0)
    goto LAB_0014c9d4;
    memcpy(__dest.zToken,__src,__n);
    __dest.zToken[__n] = '\0';
  }
  local_78._16_8_ = pSpan->pExpr;
  local_78._4_4_ = 0x1000;
  local_78._8_8_ = __dest;
  pEVar5 = exprDup(db,(Expr *)local_78,1,(u8 **)0x0);
  pCVar3[(long)sVar1 + -1].pDflt = pEVar5;
  if ((_func_int_Walker_ptr_Expr_ptr *)local_78._8_8_ != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
    sqlite3DbFreeNN(db,(void *)local_78._8_8_);
  }
LAB_0014ca2f:
  if (pSpan->pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pSpan->pExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(Parse *pParse, ExprSpan *pSpan){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pSpan->pExpr, db->init.busy) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory. The 'span' of the expression
      ** is required by pragma table_info.
      */
      Expr x;
      sqlite3ExprDelete(db, pCol->pDflt);
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbStrNDup(db, (char*)pSpan->zStart,
                                    (int)(pSpan->zEnd - pSpan->zStart));
      x.pLeft = pSpan->pExpr;
      x.flags = EP_Skip;
      pCol->pDflt = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
    }
  }
  sqlite3ExprDelete(db, pSpan->pExpr);
}